

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

bool __thiscall toml::internal::Lexer::skipUTF8BOM(Lexer *this)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = std::istream::peek();
  bVar2 = true;
  if (iVar1 == 0xef) {
    std::istream::get();
    iVar1 = std::istream::get();
    if (iVar1 == 0xbb) {
      iVar1 = std::istream::get();
      bVar2 = iVar1 == 0xbf;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

inline bool Lexer::skipUTF8BOM()
{
    // Check [EF, BB, BF]

    int x1 = is_.peek();
    if (x1 != 0xEF) {
        // When the first byte is not 0xEF, it's not UTF8 BOM.
        // Just return true.
        return true;
    }

    is_.get();
    int x2 = is_.get();
    if (x2 != 0xBB) {
        return false;
    }

    int x3 = is_.get();
    if (x3 != 0xBF) {
        return false;
    }

    return true;
}